

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

int stbi_write_jpg(char *filename,int x,int y,int comp,void *data,int quality)

{
  int iVar1;
  int r;
  stbi__write_context s;
  int in_stack_0000140c;
  void *in_stack_00001410;
  int in_stack_0000141c;
  int in_stack_00001420;
  int in_stack_00001424;
  stbi__write_context *in_stack_00001428;
  char *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined1 local_88 [132];
  int local_4;
  
  memset(local_88,0,0x58);
  iVar1 = stbi__start_write_file
                    ((stbi__write_context *)
                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     in_stack_ffffffffffffff68);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    iVar1 = stbi_write_jpg_core(in_stack_00001428,in_stack_00001424,in_stack_00001420,
                                in_stack_0000141c,in_stack_00001410,in_stack_0000140c);
    stbi__end_write_file((stbi__write_context *)0x158047);
    local_4 = iVar1;
  }
  return local_4;
}

Assistant:

STBIWDEF int stbi_write_jpg(char const *filename, int x, int y, int comp, const void *data, int quality)
{
   stbi__write_context s = { 0 };
   if (stbi__start_write_file(&s,filename)) {
      int r = stbi_write_jpg_core(&s, x, y, comp, data, quality);
      stbi__end_write_file(&s);
      return r;
   } else
      return 0;
}